

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.tab.hh
# Opt level: O0

shared_ptr<tchecker::parsing::attr_t> * __thiscall
tchecker::parsing::system::parser_t::value_type::as<std::shared_ptr<tchecker::parsing::attr_t>>
          (value_type *this)

{
  bool bVar1;
  shared_ptr<tchecker::parsing::attr_t> *psVar2;
  value_type *this_local;
  
  if (this->yytypeid_ == (type_info *)0x0) {
    __assert_fail("yytypeid_",
                  "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/build_O0/src/parsing/system_parser/system.tab.hh"
                  ,0x144,
                  "T &tchecker::parsing::system::parser_t::value_type::as() [T = std::shared_ptr<tchecker::parsing::attr_t>]"
                 );
  }
  bVar1 = std::type_info::operator==
                    (this->yytypeid_,
                     (type_info *)&std::shared_ptr<tchecker::parsing::attr_t>::typeinfo);
  if (!bVar1) {
    __assert_fail("*yytypeid_ == typeid (T)",
                  "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/build_O0/src/parsing/system_parser/system.tab.hh"
                  ,0x145,
                  "T &tchecker::parsing::system::parser_t::value_type::as() [T = std::shared_ptr<tchecker::parsing::attr_t>]"
                 );
  }
  psVar2 = yyas_<std::shared_ptr<tchecker::parsing::attr_t>>(this);
  return psVar2;
}

Assistant:

T&
    as () YY_NOEXCEPT
    {
      SPYY_ASSERT (yytypeid_);
      SPYY_ASSERT (*yytypeid_ == typeid (T));
      SPYY_ASSERT (sizeof (T) <= size);
      return *yyas_<T> ();
    }